

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

void __thiscall APlayerPawn::GiveDefaultInventory(APlayerPawn *this)

{
  byte *pbVar1;
  player_t *ppVar2;
  bool bVar3;
  int iVar4;
  PClass *pPVar5;
  AHexenArmor *pAVar6;
  ABasicArmor *this_00;
  DDropItem *pDVar7;
  PClassActor *type;
  AWeapon *this_01;
  AActor *pAVar8;
  int iVar9;
  long lVar10;
  FName local_3c;
  AActor *check;
  
  if ((this->super_AActor).player != (player_t *)0x0) {
    pPVar5 = DObject::GetClass((DObject *)this);
    AActor::GiveInventoryType
              (&this->super_AActor,(PClassActor *)AHexenArmor::RegistrationInfo.MyClass);
    pAVar6 = AActor::FindInventory<AHexenArmor>(&this->super_AActor);
    pAVar6->Slots[4] =
         (double)pPVar5[2].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
                 super_PType.Symbols.Symbols.LastFree;
    for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
      pAVar6->SlotsIncrement[lVar10] =
           *(double *)
            (&pPVar5[2].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
              super_PType.Symbols.Symbols.Size + lVar10 * 2);
    }
    this_00 = Spawn<ABasicArmor>();
    AInventory::BecomeItem((AInventory *)this_00);
    this_00->SavePercent = 0.0;
    (this_00->super_AArmor).super_AInventory.Amount = 0;
    (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x14])(this,this_00);
    pDVar7 = AActor::GetDropItems(&this->super_AActor);
    for (; pDVar7 != (DDropItem *)0x0; pDVar7 = pDVar7->Next) {
      local_3c.Index = (pDVar7->Name).Index;
      type = PClass::FindActor(&local_3c);
      if (type != (PClassActor *)0x0) {
        bVar3 = PClass::IsAncestorOf(AInventory::RegistrationInfo.MyClass,&type->super_PClass);
        if (bVar3) {
          this_01 = (AWeapon *)AActor::FindInventory(&this->super_AActor,type,false);
          if (this_01 == (AWeapon *)0x0) {
            this_01 = (AWeapon *)Spawn(type);
            pbVar1 = (byte *)((long)&(this_01->super_AStateProvider).super_AInventory.ItemFlags + 1)
            ;
            *pbVar1 = *pbVar1 | 0x40;
            (this_01->super_AStateProvider).super_AInventory.Amount = pDVar7->Amount;
            bVar3 = DObject::IsKindOf((DObject *)this_01,AWeapon::RegistrationInfo.MyClass);
            if (bVar3) {
              this_01->AmmoGive1 = 0;
              this_01->AmmoGive2 = 0;
            }
            bVar3 = AInventory::CallTryPickup((AInventory *)this_01,&this->super_AActor,&check);
            if (!bVar3) {
              if ((APlayerPawn *)check != this) {
                I_Error("Cannot give morph items when starting a game");
              }
              (*(this_01->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                super_DObject._vptr_DObject[4])(this_01);
              goto LAB_00463a11;
            }
          }
          else {
            iVar9 = (this_01->super_AStateProvider).super_AInventory.Amount;
            iVar4 = pDVar7->Amount;
            if (iVar4 == 0) {
              pAVar8 = AActor::GetDefault((AActor *)this_01);
              iVar4 = *(int *)&pAVar8[1].super_DThinker.super_DObject.Class;
            }
            iVar4 = iVar4 + iVar9;
            iVar9 = (this_01->super_AStateProvider).super_AInventory.MaxAmount;
            if (iVar4 < iVar9) {
              iVar9 = iVar4;
            }
            if (iVar4 < 1) {
              iVar9 = 0;
            }
            (this_01->super_AStateProvider).super_AInventory.Amount = iVar9;
          }
          bVar3 = DObject::IsKindOf((DObject *)this_01,AWeapon::RegistrationInfo.MyClass);
          if ((bVar3) && (bVar3 = AWeapon::CheckAmmo(this_01,2,false,false,-1), bVar3)) {
            ppVar2 = (this->super_AActor).player;
            ppVar2->PendingWeapon = this_01;
            ppVar2->ReadyWeapon = this_01;
          }
        }
        else {
          Printf("\x1cI%s is not an inventory item and cannot be given to a player as start item.\n"
                 ,FName::NameData.NameArray
                  [(type->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.TypeName.
                   Index].Text);
        }
      }
LAB_00463a11:
    }
  }
  return;
}

Assistant:

void APlayerPawn::GiveDefaultInventory ()
{
	if (player == NULL) return;

	// HexenArmor must always be the first item in the inventory because
	// it provides player class based protection that should not affect
	// any other protection item.
	PClassPlayerPawn *myclass = GetClass();
	GiveInventoryType(RUNTIME_CLASS(AHexenArmor));
	AHexenArmor *harmor = FindInventory<AHexenArmor>();
	harmor->Slots[4] = myclass->HexenArmor[0];
	for (int i = 0; i < 4; ++i)
	{
		harmor->SlotsIncrement[i] = myclass->HexenArmor[i + 1];
	}

	// BasicArmor must come right after that. It should not affect any
	// other protection item as well but needs to process the damage
	// before the HexenArmor does.
	ABasicArmor *barmor = Spawn<ABasicArmor> ();
	barmor->BecomeItem ();
	barmor->SavePercent = 0;
	barmor->Amount = 0;
	AddInventory (barmor);

	// Now add the items from the DECORATE definition
	DDropItem *di = GetDropItems();

	while (di)
	{
		PClassActor *ti = PClass::FindActor (di->Name);
		if (ti)
		{
			if (!ti->IsDescendantOf(RUNTIME_CLASS(AInventory)))
			{
				Printf(TEXTCOLOR_ORANGE "%s is not an inventory item and cannot be given to a player as start item.\n", ti->TypeName.GetChars());
			}
			else
			{
				AInventory *item = FindInventory(ti);
				if (item != NULL)
				{
					item->Amount = clamp<int>(
						item->Amount + (di->Amount ? di->Amount : ((AInventory *)item->GetDefault())->Amount),
						0, item->MaxAmount);
				}
				else
				{
					item = static_cast<AInventory *>(Spawn(ti));
					item->ItemFlags |= IF_IGNORESKILL;	// no skill multiplicators here
					item->Amount = di->Amount;
					if (item->IsKindOf(RUNTIME_CLASS(AWeapon)))
					{
						// To allow better control any weapon is emptied of
						// ammo before being given to the player.
						static_cast<AWeapon*>(item)->AmmoGive1 =
							static_cast<AWeapon*>(item)->AmmoGive2 = 0;
					}
					AActor *check;
					if (!item->CallTryPickup(this, &check))
					{
						if (check != this)
						{
							// Player was morphed. This is illegal at game start.
							// This problem is only detectable when it's too late to do something about it...
							I_Error("Cannot give morph items when starting a game");
						}
						item->Destroy();
						item = NULL;
					}
				}
				if (item != NULL && item->IsKindOf(RUNTIME_CLASS(AWeapon)) &&
					static_cast<AWeapon*>(item)->CheckAmmo(AWeapon::EitherFire, false))
				{
					player->ReadyWeapon = player->PendingWeapon = static_cast<AWeapon *> (item);
				}
			}
		}
		di = di->Next;
	}
}